

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O3

void err_set_error_data(char *data)

{
  uint uVar1;
  ERR_STATE *pEVar2;
  
  pEVar2 = err_get_state();
  if ((pEVar2 != (ERR_STATE *)0x0) && (uVar1 = pEVar2->top, uVar1 != pEVar2->bottom)) {
    free(pEVar2->errors[uVar1].data);
    pEVar2->errors[uVar1].data = data;
    return;
  }
  free(data);
  return;
}

Assistant:

static void err_set_error_data(char *data) {
  ERR_STATE *const state = err_get_state();
  struct err_error_st *error;

  if (state == NULL || state->top == state->bottom) {
    free(data);
    return;
  }

  error = &state->errors[state->top];

  free(error->data);
  error->data = data;
}